

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

vm_register * init_register(void)

{
  vm_register *pvVar1;
  undefined4 *puVar2;
  
  pvVar1 = (vm_register *)malloc(0x44);
  if (pvVar1 != (vm_register *)0x0) {
    pvVar1->R4 = 0;
    pvVar1->R5 = 0;
    pvVar1->R6 = 0;
    pvVar1->R7 = 0;
    pvVar1->flag[4] = '\0';
    pvVar1->flag[5] = '\0';
    pvVar1->flag[6] = '\0';
    pvVar1->flag[7] = '\0';
    pvVar1->flag[8] = '\0';
    pvVar1->flag[9] = '\0';
    pvVar1->flag[10] = '\0';
    pvVar1->flag[0xb] = '\0';
    *(undefined8 *)(pvVar1->flag + 0xc) = 0;
    pvVar1->SP = 0;
    pvVar1->BP = 0;
    pvVar1->IP = 0;
    pvVar1->flag[0] = '\0';
    pvVar1->flag[1] = '\0';
    pvVar1->flag[2] = '\0';
    pvVar1->flag[3] = '\0';
    pvVar1->R0 = 0;
    pvVar1->R1 = 0;
    pvVar1->R2 = 0;
    pvVar1->R3 = 0;
    pvVar1->DS = 0;
    pvVar1->R6 = 0xffffffff;
    pvVar1->R7 = 0xffffffff;
    return pvVar1;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0xf3;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

vm_register* init_register() {
	int temp{ sizeof(vm_register) };
	vm_register *ptr{ nullptr };
	ptr = (vm_register*)malloc(temp);
	if (ptr!=nullptr)
	{
		memset(ptr, 0, temp);//内存清空
		ptr->R6 = unsigned(-1);//调试寄存器值0xffffffff
		ptr->R7 = unsigned(-1);//调试寄存器值0xffffffff
		return ptr;
	}
	else throw(LVM_RIGISTER_SEGEMENT_ERROR);
}